

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

void absl::UnrefSynchEvent(SynchEvent *e)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  uVar1 = synch_event_mu;
  if (e != (SynchEvent *)0x0) {
    if ((synch_event_mu & 1) == 0) {
      synch_event_mu = synch_event_mu | 1;
      LOCK();
      UNLOCK();
    }
    if ((uVar1 & 1) != 0) {
      base_internal::SpinLock::SlowLock((SpinLock *)&synch_event_mu);
    }
    iVar2 = e->refcount + -1;
    e->refcount = iVar2;
    uVar1 = synch_event_mu;
    uVar3 = synch_event_mu & 2;
    LOCK();
    UNLOCK();
    bVar4 = 7 < synch_event_mu;
    synch_event_mu = uVar3;
    if (bVar4) {
      base_internal::SpinLock::SlowUnlock((SpinLock *)&synch_event_mu,uVar1);
    }
    if (iVar2 == 0) {
      base_internal::LowLevelAlloc::Free(e);
      return;
    }
  }
  return;
}

Assistant:

static void UnrefSynchEvent(SynchEvent* e) {
  if (e != nullptr) {
    synch_event_mu.Lock();
    bool del = (--(e->refcount) == 0);
    synch_event_mu.Unlock();
    if (del) {
      base_internal::LowLevelAlloc::Free(e);
    }
  }
}